

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIDCAppendNodeTableItem
              (xmlSchemaPSVIIDCBindingPtr_conflict bind,xmlSchemaPSVIIDCNodePtr ntItem)

{
  int iVar1;
  xmlSchemaPSVIIDCNodePtr *ppxVar2;
  xmlSchemaPSVIIDCNodePtr ntItem_local;
  xmlSchemaPSVIIDCBindingPtr_conflict bind_local;
  
  if (bind->nodeTable == (xmlSchemaPSVIIDCNodePtr *)0x0) {
    bind->sizeNodes = 10;
    ppxVar2 = (xmlSchemaPSVIIDCNodePtr *)(*xmlMalloc)(0x50);
    bind->nodeTable = ppxVar2;
    if (bind->nodeTable == (xmlSchemaPSVIIDCNodePtr *)0x0) {
      xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating an array of IDC node-table items",
                          (xmlNodePtr)0x0);
      return -1;
    }
  }
  else if (bind->sizeNodes <= bind->nbNodes) {
    bind->sizeNodes = bind->sizeNodes << 1;
    ppxVar2 = (xmlSchemaPSVIIDCNodePtr *)(*xmlRealloc)(bind->nodeTable,(long)bind->sizeNodes << 3);
    bind->nodeTable = ppxVar2;
    if (bind->nodeTable == (xmlSchemaPSVIIDCNodePtr *)0x0) {
      xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,
                          "re-allocating an array of IDC node-table items",(xmlNodePtr)0x0);
      return -1;
    }
  }
  iVar1 = bind->nbNodes;
  bind->nbNodes = iVar1 + 1;
  bind->nodeTable[iVar1] = ntItem;
  return 0;
}

Assistant:

static int
xmlSchemaIDCAppendNodeTableItem(xmlSchemaPSVIIDCBindingPtr bind,
				xmlSchemaPSVIIDCNodePtr ntItem)
{
    if (bind->nodeTable == NULL) {
	bind->sizeNodes = 10;
	bind->nodeTable = (xmlSchemaPSVIIDCNodePtr *)
	    xmlMalloc(10 * sizeof(xmlSchemaPSVIIDCNodePtr));
	if (bind->nodeTable == NULL) {
	    xmlSchemaVErrMemory(NULL,
		"allocating an array of IDC node-table items", NULL);
	    return(-1);
	}
    } else if (bind->sizeNodes <= bind->nbNodes) {
	bind->sizeNodes *= 2;
	bind->nodeTable = (xmlSchemaPSVIIDCNodePtr *)
	    xmlRealloc(bind->nodeTable, bind->sizeNodes *
		sizeof(xmlSchemaPSVIIDCNodePtr));
	if (bind->nodeTable == NULL) {
	    xmlSchemaVErrMemory(NULL,
		"re-allocating an array of IDC node-table items", NULL);
	    return(-1);
	}
    }
    bind->nodeTable[bind->nbNodes++] = ntItem;
    return(0);
}